

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssxmlExporter.cpp
# Opt level: O0

void Assimp::AssxmlExport::WriteNode(aiNode *node,IOStream *io,uint depth)

{
  uint local_644;
  uint local_640;
  uint i_2;
  uint i_1;
  aiString name;
  aiMatrix4x4 *m;
  undefined1 local_228 [4];
  uint i;
  char prefix [512];
  uint depth_local;
  IOStream *io_local;
  aiNode *node_local;
  
  prefix._508_4_ = depth;
  for (m._4_4_ = 0; m._4_4_ < (uint)prefix._508_4_; m._4_4_ = m._4_4_ + 1) {
    local_228[m._4_4_] = 9;
  }
  local_228[(uint)prefix._508_4_] = 0;
  name.data._1016_8_ = &node->mTransformation;
  aiString::aiString((aiString *)&i_2);
  ConvertName((aiString *)&i_2,&node->mName);
  ioprintf(io,
           "%s<Node name=\"%s\"> \n%s\t<Matrix4> \n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t\t%0 6f %0 6f %0 6f %0 6f\n%s\t</Matrix4> \n"
           ,(double)*(float *)name.data._1016_8_,(double)*(float *)(name.data._1016_8_ + 4),
           (double)*(float *)(name.data._1016_8_ + 8),(double)*(float *)(name.data._1016_8_ + 0xc),
           (double)*(float *)(name.data._1016_8_ + 0x10),
           (double)*(float *)(name.data._1016_8_ + 0x14),
           (double)*(float *)(name.data._1016_8_ + 0x18),
           (double)*(float *)(name.data._1016_8_ + 0x1c),local_228,&i_1,local_228,local_228,
           local_228,local_228,(double)*(float *)(name.data._1016_8_ + 0x20),
           (double)*(float *)(name.data._1016_8_ + 0x24),
           (double)*(float *)(name.data._1016_8_ + 0x28),
           (double)*(float *)(name.data._1016_8_ + 0x2c),local_228,
           (double)*(float *)(name.data._1016_8_ + 0x30),
           (double)*(float *)(name.data._1016_8_ + 0x34),
           (double)*(float *)(name.data._1016_8_ + 0x38),
           (double)*(float *)(name.data._1016_8_ + 0x3c),local_228);
  if (node->mNumMeshes != 0) {
    ioprintf(io,"%s\t<MeshRefs num=\"%i\">\n%s\t",local_228,(ulong)node->mNumMeshes,local_228);
    for (local_640 = 0; local_640 < node->mNumMeshes; local_640 = local_640 + 1) {
      ioprintf(io,"%i ",(ulong)node->mMeshes[local_640]);
    }
    ioprintf(io,"\n%s\t</MeshRefs>\n",local_228);
  }
  if (node->mNumChildren != 0) {
    ioprintf(io,"%s\t<NodeList num=\"%i\">\n",local_228,(ulong)node->mNumChildren);
    for (local_644 = 0; local_644 < node->mNumChildren; local_644 = local_644 + 1) {
      WriteNode(node->mChildren[local_644],io,prefix._508_4_ + 2);
    }
    ioprintf(io,"%s\t</NodeList>\n",local_228);
  }
  ioprintf(io,"%s</Node>\n",local_228);
  return;
}

Assistant:

static void WriteNode(const aiNode* node, IOStream * io, unsigned int depth) {
    char prefix[512];
    for (unsigned int i = 0; i < depth;++i)
        prefix[i] = '\t';
    prefix[depth] = '\0';

    const aiMatrix4x4& m = node->mTransformation;

    aiString name;
    ConvertName(name,node->mName);
    ioprintf(io,"%s<Node name=\"%s\"> \n"
        "%s\t<Matrix4> \n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t\t%0 6f %0 6f %0 6f %0 6f\n"
        "%s\t</Matrix4> \n",
        prefix,name.data,prefix,
        prefix,m.a1,m.a2,m.a3,m.a4,
        prefix,m.b1,m.b2,m.b3,m.b4,
        prefix,m.c1,m.c2,m.c3,m.c4,
        prefix,m.d1,m.d2,m.d3,m.d4,prefix);

    if (node->mNumMeshes) {
        ioprintf(io, "%s\t<MeshRefs num=\"%i\">\n%s\t",
            prefix,node->mNumMeshes,prefix);

        for (unsigned int i = 0; i < node->mNumMeshes;++i) {
            ioprintf(io,"%i ",node->mMeshes[i]);
        }
        ioprintf(io,"\n%s\t</MeshRefs>\n",prefix);
    }

    if (node->mNumChildren) {
        ioprintf(io,"%s\t<NodeList num=\"%i\">\n",
            prefix,node->mNumChildren);

        for (unsigned int i = 0; i < node->mNumChildren;++i) {
            WriteNode(node->mChildren[i],io,depth+2);
        }
        ioprintf(io,"%s\t</NodeList>\n",prefix);
    }
    ioprintf(io,"%s</Node>\n",prefix);
}